

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O3

void stbir__horizontal_gather_4_channels_with_6_coeffs
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float *pfVar30;
  long lVar31;
  float fVar32;
  float fVar33;
  
  pfVar1 = output_buffer + (output_sub_size << 2);
  pfVar30 = horizontal_coefficients + 4;
  do {
    lVar31 = (long)horizontal_contributors->n0;
    fVar8 = pfVar30[-4];
    fVar9 = pfVar30[-3];
    fVar10 = pfVar30[-2];
    fVar11 = pfVar30[-1];
    pfVar2 = decode_buffer + lVar31 * 4;
    fVar12 = pfVar2[1];
    fVar13 = pfVar2[2];
    fVar14 = pfVar2[3];
    pfVar3 = decode_buffer + lVar31 * 4 + 4;
    fVar15 = pfVar3[1];
    fVar16 = pfVar3[2];
    fVar17 = pfVar3[3];
    pfVar4 = decode_buffer + lVar31 * 4 + 8;
    fVar18 = pfVar4[1];
    fVar19 = pfVar4[2];
    fVar20 = pfVar4[3];
    pfVar5 = decode_buffer + lVar31 * 4 + 0xc;
    fVar21 = pfVar5[1];
    fVar22 = pfVar5[2];
    fVar23 = pfVar5[3];
    fVar32 = (float)*(undefined8 *)pfVar30;
    fVar33 = (float)((ulong)*(undefined8 *)pfVar30 >> 0x20);
    pfVar6 = decode_buffer + lVar31 * 4 + 0x10;
    fVar24 = pfVar6[1];
    fVar25 = pfVar6[2];
    fVar26 = pfVar6[3];
    pfVar7 = decode_buffer + lVar31 * 4 + 0x14;
    fVar27 = pfVar7[1];
    fVar28 = pfVar7[2];
    fVar29 = pfVar7[3];
    *output_buffer =
         fVar33 * *pfVar7 + fVar11 * *pfVar5 + fVar9 * *pfVar3 +
         *pfVar6 * fVar32 + fVar10 * *pfVar4 + *pfVar2 * fVar8;
    output_buffer[1] =
         fVar33 * fVar27 + fVar11 * fVar21 + fVar9 * fVar15 +
         fVar24 * fVar32 + fVar10 * fVar18 + fVar12 * fVar8;
    output_buffer[2] =
         fVar33 * fVar28 + fVar11 * fVar22 + fVar9 * fVar16 +
         fVar25 * fVar32 + fVar10 * fVar19 + fVar13 * fVar8;
    output_buffer[3] =
         fVar33 * fVar29 + fVar11 * fVar23 + fVar9 * fVar17 +
         fVar26 * fVar32 + fVar10 * fVar20 + fVar14 * fVar8;
    horizontal_contributors = horizontal_contributors + 1;
    output_buffer = output_buffer + 4;
    pfVar30 = pfVar30 + coefficient_width;
  } while (output_buffer < pfVar1);
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_6_coeffs)( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    float const * hc = horizontal_coefficients;
    stbir__4_coeff_start();
    stbir__2_coeff_remnant(4);
    stbir__store_output();
  } while ( output < output_end );
}